

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O3

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnWcsicmp_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnWcsicmp_Test *this)

{
  wint_t wVar1;
  wint_t wVar2;
  int iVar3;
  int *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  AssertionResult iutest_ar;
  int *in_stack_fffffffffffffde8;
  AssertionResult local_210;
  AssertionHelper local_1e8;
  undefined1 local_1b8 [392];
  
  local_1b8._0_4_ = 0;
  lVar5 = 0;
  do {
    wVar2 = *(wint_t *)((long)L"aaaa" + lVar5 + 4);
    if (*(wint_t *)((long)L"AAA" + lVar5) == 0) {
      wVar1 = towupper(0);
      wVar2 = towupper(wVar2);
      local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = wVar1 - wVar2;
      break;
    }
    wVar1 = towupper(*(wint_t *)((long)L"AAA" + lVar5));
    wVar2 = towupper(wVar2);
    lVar5 = lVar5 + 4;
    local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = wVar1 - wVar2;
  } while ((int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p == 0);
  iutest::internal::CmpHelperEQ<int,int>
            (&local_210,(internal *)0x16fae4,
             "::iutest::detail::wrapper::iu_wcsicmp(L\"AAA\", L\"aaa\")",local_1b8,(int *)&local_1e8
             ,in_R9);
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x4f;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar5 = 0;
  do {
    wVar2 = *(wint_t *)((long)L"aaaa" + lVar5 + 4);
    if (*(wint_t *)((long)L"AAAa" + lVar5) == 0) {
      wVar1 = towupper(0);
      wVar2 = towupper(wVar2);
      iVar3 = wVar1 - wVar2;
      break;
    }
    wVar1 = towupper(*(wint_t *)((long)L"AAAa" + lVar5));
    wVar2 = towupper(wVar2);
    lVar5 = lVar5 + 4;
    iVar3 = wVar1 - wVar2;
  } while (iVar3 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar3;
  if ((int)local_1b8._0_4_ < iVar3) {
    local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x16fae4,
               "::iutest::detail::wrapper::iu_wcsicmp(L\"AAAa\", L\"aaa\")","<",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
    if ((local_210.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffdef);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x50;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar5 = 0;
  do {
    wVar2 = *(wint_t *)((long)L"aaaa" + lVar5);
    if (*(wint_t *)((long)L"AAAB" + lVar5) == 0) {
      wVar1 = towupper(0);
      wVar2 = towupper(wVar2);
      iVar3 = wVar1 - wVar2;
      break;
    }
    wVar1 = towupper(*(wint_t *)((long)L"AAAB" + lVar5));
    wVar2 = towupper(wVar2);
    lVar5 = lVar5 + 4;
    iVar3 = wVar1 - wVar2;
  } while (iVar3 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar3;
  if ((int)local_1b8._0_4_ < iVar3) {
    local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x16fae4,
               "::iutest::detail::wrapper::iu_wcsicmp(L\"AAAB\", L\"aaaa\")","<",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
    if ((local_210.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffdef);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x51;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  paVar4 = &local_210.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar4) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar5 = 0;
  do {
    wVar2 = *(wint_t *)((long)L"aaaB" + lVar5);
    if (*(wint_t *)((long)L"AAAa" + lVar5) == 0) {
      wVar1 = towupper(0);
      wVar2 = towupper(wVar2);
      iVar3 = wVar1 - wVar2;
      break;
    }
    wVar1 = towupper(*(wint_t *)((long)L"AAAa" + lVar5));
    wVar2 = towupper(wVar2);
    lVar5 = lVar5 + 4;
    iVar3 = wVar1 - wVar2;
  } while (iVar3 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar3;
  if (iVar3 < (int)local_1b8._0_4_) {
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
    local_210.m_message._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x16fae4,
               "::iutest::detail::wrapper::iu_wcsicmp(L\"AAAa\", L\"aaaB\")",">",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
    if ((local_210.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffdef);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x52;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar4) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar5 = 0;
  do {
    wVar2 = *(wint_t *)((long)L"aaaA" + lVar5);
    if (*(wint_t *)((long)L"AAA" + lVar5) == 0) {
      wVar1 = towupper(0);
      wVar2 = towupper(wVar2);
      iVar3 = wVar1 - wVar2;
      break;
    }
    wVar1 = towupper(*(wint_t *)((long)L"AAA" + lVar5));
    wVar2 = towupper(wVar2);
    lVar5 = lVar5 + 4;
    iVar3 = wVar1 - wVar2;
  } while (iVar3 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar3;
  if (iVar3 < 0) {
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
    local_210.m_message._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x16fae4,
               "::iutest::detail::wrapper::iu_wcsicmp(L\"AAA\", L\"aaaA\")",">",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
    if ((local_210.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffdef);
      local_1e8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
      ;
      local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x53;
      local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != paVar4) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnWcsicmp)
{
    IUTEST_EXPECT_EQ(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAA", L"aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAAa", L"aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAAB", L"aaaa"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAAa", L"aaaB"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAA", L"aaaA"));
}